

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

string * (anonymous_namespace)::WindowsImplX11Impl::findExecutableName_abi_cxx11_(void)

{
  reference pvVar1;
  size_type __new_size;
  char *pcVar2;
  string *in_RDI;
  ssize_t result;
  size_t offset;
  vector<char,_std::allocator<char>_> buffer;
  int file;
  allocator_type *in_stack_ffffffffffffff58;
  allocator *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int __fd;
  vector<char,_std::allocator<char>_> *this;
  allocator local_59;
  undefined4 local_58;
  allocator local_52;
  undefined1 local_51;
  size_type local_50;
  size_type local_48;
  undefined1 local_3a [45];
  allocator local_d;
  int local_c;
  
  local_c = open("/proc/self/cmdline",0x800);
  if (local_c < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"sfml",&local_d);
    std::allocator<char>::~allocator((allocator<char> *)&local_d);
  }
  else {
    local_3a[1] = 0;
    this = (vector<char,_std::allocator<char>_> *)local_3a;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,(value_type *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    std::allocator<char>::~allocator((allocator<char> *)local_3a);
    local_48 = 0;
    local_50 = 0;
    while( true ) {
      __fd = local_c;
      pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(local_3a + 2),local_48);
      __new_size = read(__fd,pvVar1,0x100);
      local_50 = __new_size;
      if ((long)__new_size < 1) break;
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)(local_3a + 2));
      local_51 = 0;
      std::vector<char,_std::allocator<char>_>::resize
                (this,__new_size,(value_type *)CONCAT44(__fd,in_stack_ffffffffffffff70));
      local_48 = local_50 + local_48;
    }
    close(local_c);
    if (local_48 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"sfml",&local_59);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    else {
      pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(local_3a + 2),local_48);
      *pvVar1 = '\0';
      pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(local_3a + 2),0);
      pcVar2 = __xpg_basename(pvVar1);
      in_stack_ffffffffffffff60 = &local_52;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar2,in_stack_ffffffffffffff60);
      std::allocator<char>::~allocator((allocator<char> *)&local_52);
    }
    local_58 = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff60);
  }
  return in_RDI;
}

Assistant:

std::string findExecutableName()
        {
            // We use /proc/self/cmdline to get the command line
            // the user used to invoke this instance of the application
            int file = ::open("/proc/self/cmdline", O_RDONLY | O_NONBLOCK);

            if (file < 0)
                return "sfml";

            std::vector<char> buffer(256, 0);
            std::size_t offset = 0;
            ssize_t result = 0;

            while ((result = read(file, &buffer[offset], 256)) > 0)
            {
                buffer.resize(buffer.size() + static_cast<std::size_t>(result), 0);
                offset += static_cast<std::size_t>(result);
            }

            ::close(file);

            if (offset)
            {
                buffer[offset] = 0;

                // Remove the path to keep the executable name only
                return basename(&buffer[0]);
            }

            // Default fallback name
            return "sfml";
        }